

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::OneofDescriptorTest_Normal_Test::
~OneofDescriptorTest_Normal_Test(OneofDescriptorTest_Normal_Test *this)

{
  (this->super_OneofDescriptorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__OneofDescriptorTest_018e09f0;
  DescriptorPool::~DescriptorPool(&(this->super_OneofDescriptorTest).pool_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,200);
  return;
}

Assistant:

TEST_F(OneofDescriptorTest, Normal) {
  EXPECT_EQ("foo", oneof_->name());
  EXPECT_EQ("garply.TestOneof.foo", oneof_->full_name());
  EXPECT_EQ(0, oneof_->index());
  ASSERT_EQ(2, oneof_->field_count());
  EXPECT_EQ(b_, oneof_->field(0));
  EXPECT_EQ(c_, oneof_->field(1));
  EXPECT_TRUE(a_->containing_oneof() == nullptr);
  EXPECT_EQ(oneof_, b_->containing_oneof());
  EXPECT_EQ(oneof_, c_->containing_oneof());
}